

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> * __thiscall
dg::vr::RelationsAnalyzer::getBranchChangeLocations
          (vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
           *__return_storage_ptr__,RelationsAnalyzer *this,VRLocation *join,
          VectorSet<const_llvm::Value_*> *froms)

{
  pointer ppVVar1;
  pointer ppVVar2;
  bool bVar3;
  pointer ppVVar4;
  HandlePtr pBVar5;
  ulong uVar6;
  pointer ppVVar7;
  bool bVar8;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> changeLocations;
  VRLocation *loc;
  VectorSet<const_llvm::Value_*> *__range3;
  pointer local_68;
  iterator iStack_60;
  pointer local_58;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *local_48;
  VRLocation *local_40;
  VectorSet<const_llvm::Value_*> *local_38;
  
  local_68 = (pointer)0x0;
  iStack_60._M_current = (pointer)0x0;
  local_58 = (pointer)0x0;
  ppVVar4 = (join->predecessors).
            super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_48 = __return_storage_ptr__;
  local_38 = froms;
  if ((int)((ulong)((long)(join->predecessors).
                          super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar4) >> 3) != 0) {
    uVar6 = 0;
    do {
      local_40 = ppVVar4[uVar6]->source;
      ppVVar1 = (local_38->vec).
                super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppVVar2 = (local_38->vec).
                super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppVVar1 == ppVVar2) {
        bVar3 = false;
      }
      else {
        do {
          ppVVar7 = ppVVar1 + 1;
          pBVar5 = ValueRelations::maybeGet(&local_40->relations,*ppVVar1);
          if (pBVar5 == (HandlePtr)0x0) {
            bVar8 = false;
          }
          else {
            bVar8 = (pBVar5->relatedBuckets)._M_elems[10].vec.
                    super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    (pBVar5->relatedBuckets)._M_elems[10].vec.
                    super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          }
          bVar3 = false;
          if (bVar8) {
            bVar3 = true;
            break;
          }
          ppVVar1 = ppVVar7;
        } while (ppVVar7 != ppVVar2);
      }
      if (bVar3) {
        if (iStack_60._M_current == local_58) {
          std::vector<dg::vr::VRLocation_const*,std::allocator<dg::vr::VRLocation_const*>>::
          _M_realloc_insert<dg::vr::VRLocation*&>
                    ((vector<dg::vr::VRLocation_const*,std::allocator<dg::vr::VRLocation_const*>> *)
                     &local_68,iStack_60,&local_40);
        }
        else {
          *iStack_60._M_current = local_40;
          iStack_60._M_current = iStack_60._M_current + 1;
        }
      }
      else {
        (local_48->
        super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>)
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_48->
        super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>)
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_48->
        super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>)
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      if (!bVar3) goto LAB_0011f5a1;
      uVar6 = uVar6 + 1;
      ppVVar4 = (join->predecessors).
                super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar6 < ((ulong)((long)(join->predecessors).
                                    super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar4) >> 3
                     & 0xffffffff));
  }
  (local_48->
  super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>).
  _M_impl.super__Vector_impl_data._M_start = local_68;
  (local_48->
  super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = iStack_60._M_current;
  (local_48->
  super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_58;
  local_68 = (pointer)0x0;
  iStack_60._M_current = (pointer)0x0;
  local_58 = (pointer)0x0;
LAB_0011f5a1:
  if (local_68 != (pointer)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return local_48;
}

Assistant:

std::vector<const VRLocation *>
RelationsAnalyzer::getBranchChangeLocations(const VRLocation &join,
                                            const VectorSet<V> &froms) const {
    std::vector<const VRLocation *> changeLocations;
    for (unsigned i = 0; i < join.predsSize(); ++i) {
        auto loc = join.getPredLocation(i);
        bool hasLoad = false;
        for (V from : froms) {
            if (loc->relations.hasLoad(from)) {
                hasLoad = true;
                break;
            }
        }
        if (!hasLoad)
            return {};
        changeLocations.emplace_back(loc);
    }
    return changeLocations;
}